

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

string * polyscope::view::to_string_abi_cxx11_(ProjectionMode mode)

{
  int in_ESI;
  string *in_RDI;
  allocator local_1e;
  allocator local_1d [16];
  allocator local_d [13];
  
  if (in_ESI == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Perspective",local_d);
    std::allocator<char>::~allocator((allocator<char> *)local_d);
  }
  else if (in_ESI == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Orthographic",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_1e);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
  }
  return in_RDI;
}

Assistant:

std::string to_string(ProjectionMode mode) {
  switch (mode) {
  case ProjectionMode::Perspective:
    return "Perspective";
  case ProjectionMode::Orthographic:
    return "Orthographic";
  }
  return ""; // unreachable
}